

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O3

operation_t * op_get(int symbol,int ver)

{
  operation_t *poVar1;
  operation_t *poVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = ver - 2;
  if ((uVar4 < 7) && ((0x67U >> (uVar4 & 0x1f) & 1) != 0)) {
    poVar2 = (operation_t *)(&PTR_ops_v2_v3_00150c00)[uVar4];
    iVar3 = poVar2->symbol;
    while (iVar3 != 0) {
      if (iVar3 == symbol) {
        return poVar2;
      }
      poVar1 = poVar2 + 1;
      poVar2 = poVar2 + 1;
      iVar3 = poVar1->symbol;
    }
  }
  return (operation_t *)0x0;
}

Assistant:

const operation_t*
op_get(
    int symbol,
    int ver
) {
    const operation_t* table = op_get_table(ver);
    if (table != NULL) {
        while(table->symbol) {
            if (table->symbol == symbol)
                return table;
            ++table;
        }
    }
    return NULL;
}